

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qerrormessage.cpp
# Opt level: O0

void __thiscall QErrorMessagePrivate::setVisible(QErrorMessagePrivate *this,bool visible)

{
  ulong uVar1;
  long *in_RDI;
  bool in_stack_0000000f;
  QDialog *q;
  bool in_stack_00000037;
  QDialogPrivate *in_stack_00000038;
  bool in_stack_00000043;
  WidgetAttribute in_stack_00000044;
  QWidget *in_stack_00000048;
  
  uVar1 = (**(code **)(*in_RDI + 0xa8))();
  if ((uVar1 & 1) != 0) {
    QDialogPrivate::setNativeDialogVisible((QDialogPrivate *)q,in_stack_0000000f);
  }
  QWidget::setAttribute(in_stack_00000048,in_stack_00000044,in_stack_00000043);
  QDialogPrivate::setVisible(in_stack_00000038,in_stack_00000037);
  return;
}

Assistant:

void QErrorMessagePrivate::setVisible(bool visible)
{
    // Don't use Q_Q here! This function is called from ~QDialog,
    // so Q_Q calling q_func() invokes undefined behavior (invalid cast in q_func()).
    const auto q = static_cast<QDialog *>(q_ptr);

    if (canBeNativeDialog())
        setNativeDialogVisible(visible);

    // Update WA_DontShowOnScreen based on whether the native dialog was shown,
    // so that QDialog::setVisible(visible) below updates the QWidget state correctly,
    // but skips showing the non-native version.
    q->setAttribute(Qt::WA_DontShowOnScreen, nativeDialogInUse);

    QDialogPrivate::setVisible(visible);
}